

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

Function * __thiscall LLVMBC::Module::getFunction(Module *this,String *name)

{
  bool bVar1;
  reference ppFVar2;
  __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
  local_48;
  Function **local_40;
  Function **local_38;
  __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
  local_30;
  __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
  local_28;
  __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
  itr;
  String *name_local;
  Module *this_local;
  
  itr._M_current = (Function **)name;
  local_30._M_current =
       (Function **)
       std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::begin
                 (&this->functions);
  local_38 = (Function **)
             std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::
             end(&this->functions);
  local_40 = itr._M_current;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<LLVMBC::Function*const*,std::vector<LLVMBC::Function*,dxil_spv::ThreadLocalAllocator<LLVMBC::Function*>>>,LLVMBC::Module::getFunction(std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&)const::__0>
                       (local_30,(__normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
                                  )local_38,itr._M_current);
  local_48._M_current =
       (Function **)
       std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>::end
                 (&this->functions);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_48);
  if (bVar1) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<LLVMBC::Function_*const_*,_std::vector<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>_>
              ::operator*(&local_28);
    this_local = (Module *)*ppFVar2;
  }
  else {
    this_local = (Module *)0x0;
  }
  return (Function *)this_local;
}

Assistant:

Function *Module::getFunction(const String &name) const
{
	auto itr =
	    std::find_if(functions.begin(), functions.end(), [&](const Function *func) { return func->getName() == name; });

	if (itr != functions.end())
		return *itr;
	else
		return nullptr;
}